

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O0

void __thiscall Kgc::sweep(Kgc *this)

{
  Value *v;
  Value *unreached;
  Value **object;
  Kgc *this_local;
  
  unreached = (Value *)&this->firstObject_;
  while (unreached->_vptr_Value != (_func_int **)0x0) {
    if (*(int *)((long)unreached->_vptr_Value + 0xc) == 0) {
      v = (Value *)unreached->_vptr_Value;
      unreached->_vptr_Value = (_func_int **)v->next_;
      dealloc(this,v);
    }
    else {
      *(undefined4 *)((long)unreached->_vptr_Value + 0xc) = 0;
      unreached = (Value *)(unreached->_vptr_Value + 2);
    }
  }
  return;
}

Assistant:

void Kgc::sweep()
{
    const Value **object = &firstObject_;
    while (*object)
    {
        if (!(*object)->marked_)
        {
            const Value *unreached = *object;
            *object = unreached->next_;
            dealloc(unreached);
        } else
        {
            (*object)->marked_ = 0;
            object = (const Value **)&(*object)->next_;
        }
    }
}